

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * __thiscall
lest::to_string<std::optional<long>,int>
          (string *__return_storage_ptr__,lest *this,optional<long> *lhs,string *op,int *rhs)

{
  ostream *poVar1;
  optional<long> *value;
  int *value_00;
  ostringstream os;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  string_maker<std::optional<long>>::to_string_abi_cxx11_
            (&local_1b8,(string_maker<std::optional<long>> *)this,value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)(lhs->super__Optional_base<long,_true,_true>)._M_payload.
                                     super__Optional_payload_base<long>._M_payload,
                      *(long *)&(lhs->super__Optional_base<long,_true,_true>)._M_payload.
                                super__Optional_payload_base<long>._M_engaged);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  string_maker<int>::to_string_abi_cxx11_(&local_1d8,(string_maker<int> *)op,value_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}